

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O1

void QDir::setSearchPaths(QString *prefix,QStringList *searchPaths)

{
  ushort uVar1;
  ulong uVar2;
  char16_t *pcVar3;
  bool bVar4;
  Type *this;
  long lVar5;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dirSearchPaths>_> *this_00;
  QReadWriteLock *this_01;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dirSearchPaths>_> *pQVar6;
  long in_FS_OFFSET;
  bool bVar7;
  QMessageLogger local_58;
  long local_38;
  
  pQVar6 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dirSearchPaths>_> *)
           &local_58;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = (prefix->d).size;
  if (uVar2 < 2) {
    setSearchPaths();
  }
  else {
    pcVar3 = (prefix->d).ptr;
    lVar5 = 0;
    bVar7 = false;
    do {
      uVar1 = *(ushort *)((long)pcVar3 + lVar5);
      this_00 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dirSearchPaths>_>
                 *)(ulong)uVar1;
      if (((9 < uVar1 - 0x30) && (0x39 < uVar1 - 0x41 || 0xfffffff9 < uVar1 - 0x61)) &&
         ((uVar1 < 0x80 || (bVar4 = QChar::isLetterOrNumber_helper((uint)uVar1), !bVar4)))) {
        local_58.context.version = 2;
        local_58.context.line = 0;
        local_58.context.file._0_4_ = 0;
        local_58.context._12_8_ = 0;
        local_58.context.function._4_4_ = 0;
        local_58.context.category = "default";
        QMessageLogger::warning
                  (&local_58,"QDir::setSearchPaths: Prefix can only contain letters or numbers");
        this_00 = pQVar6;
        if (!bVar7) goto LAB_00227391;
        break;
      }
      lVar5 = lVar5 + 2;
      bVar7 = uVar2 * 2 == lVar5;
    } while (!bVar7);
    this = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dirSearchPaths>_>::
           operator*(this_00);
    local_58.context.version = (int)this;
    local_58.context.line = (int)((ulong)this >> 0x20);
    QReadWriteLock::lockForWrite(&this->mutex);
    local_58.context.version = local_58.context.version | 1;
    if ((searchPaths->d).size == 0) {
      QHash<QString,_QList<QString>_>::removeImpl<QString>(&this->paths,prefix);
    }
    else {
      QHash<QString,QList<QString>>::emplace<QList<QString>const&>
                ((QHash<QString,QList<QString>> *)&this->paths,prefix,searchPaths);
    }
    if ((local_58.context.version & 1U) != 0) {
      this_01 = (QReadWriteLock *)
                (CONCAT44(local_58.context.line,local_58.context.version) & 0xfffffffffffffffe);
      local_58.context.version = (int)this_01;
      local_58.context.line = (int)((ulong)this_01 >> 0x20);
      QReadWriteLock::unlock(this_01);
    }
  }
LAB_00227391:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDir::setSearchPaths(const QString &prefix, const QStringList &searchPaths)
{
    if (prefix.size() < 2) {
        qWarning("QDir::setSearchPaths: Prefix must be longer than 1 character");
        return;
    }

    for (QChar ch : prefix) {
        if (!ch.isLetterOrNumber()) {
            qWarning("QDir::setSearchPaths: Prefix can only contain letters or numbers");
            return;
        }
    }

    DirSearchPaths &conf = *dirSearchPaths;
    const QWriteLocker lock(&conf.mutex);
    if (searchPaths.isEmpty()) {
        conf.paths.remove(prefix);
    } else {
        conf.paths.insert(prefix, searchPaths);
    }
}